

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

void __thiscall Vector<Fad<double>_>::Vector(Vector<Fad<double>_> *this,Vector<Fad<double>_> *a)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  Fad<double> *pFVar5;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RSI;
  Vector<Fad<double>_> *in_RDI;
  ulong uVar6;
  Fad<double> *local_50;
  
  in_RDI->num_elts = *(int *)in_RSI;
  in_RDI->ptr_to_data = (Fad<double> *)0x0;
  if (in_RDI->num_elts != 0) {
    uVar2 = (ulong)in_RDI->num_elts;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x20),0);
    uVar6 = uVar3 + 8;
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar3) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar4 = (ulong *)operator_new__(uVar6);
    *puVar4 = uVar2;
    pFVar5 = (Fad<double> *)(puVar4 + 1);
    src = extraout_RDX;
    if (uVar2 != 0) {
      local_50 = pFVar5;
      do {
        Fad<double>::Fad(local_50);
        local_50 = local_50 + 1;
        src = extraout_RDX_00;
      } while (local_50 != pFVar5 + uVar2);
    }
    in_RDI->ptr_to_data = pFVar5;
    copy(in_RDI,in_RSI,src);
  }
  return;
}

Assistant:

inline Vector< T >::Vector(const Vector< T >& a) : num_elts(a.num_elts), ptr_to_data((T*)0)
// copy constructor
{
#ifdef DEBUG
	std::cerr << "Vector<>::Vector(const Vector< T >& ) |copy constructor   |";
#endif
    
    if ( num_elts != 0 ) {
      ptr_to_data = new T[num_elts];
      copy(a);
    }

#ifdef DEBUG
    fprintf(stderr," adr =  %x \n", ptr_to_data);
#endif
}